

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cstring.cpp
# Opt level: O1

int uprv_stricmp_63(char *str1,char *str2)

{
  byte bVar1;
  long lVar2;
  byte bVar3;
  byte bVar4;
  bool bVar5;
  
  if (str1 == (char *)0x0) {
    bVar5 = str2 != (char *)0x0;
  }
  else {
    if (str2 == (char *)0x0) {
      return 1;
    }
    bVar3 = *str1;
    bVar4 = *str2;
    if (bVar3 != 0) {
      lVar2 = 1;
      do {
        if (bVar4 == 0) {
          return 1;
        }
        bVar1 = bVar3 | 0x20;
        if (0x19 < (byte)(bVar3 + 0xbf)) {
          bVar1 = bVar3;
        }
        bVar3 = bVar4 | 0x20;
        if (0x19 < (byte)(bVar4 + 0xbf)) {
          bVar3 = bVar4;
        }
        if ((uint)bVar1 - (uint)bVar3 != 0) {
          return (uint)bVar1 - (uint)bVar3;
        }
        bVar3 = str1[lVar2];
        bVar4 = str2[lVar2];
        lVar2 = lVar2 + 1;
      } while (bVar3 != 0);
    }
    bVar5 = bVar4 != 0;
  }
  return -(uint)bVar5;
}

Assistant:

U_CAPI int U_EXPORT2
uprv_stricmp(const char *str1, const char *str2) {
    if(str1==NULL) {
        if(str2==NULL) {
            return 0;
        } else {
            return -1;
        }
    } else if(str2==NULL) {
        return 1;
    } else {
        /* compare non-NULL strings lexically with lowercase */
        int rc;
        unsigned char c1, c2;

        for(;;) {
            c1=(unsigned char)*str1;
            c2=(unsigned char)*str2;
            if(c1==0) {
                if(c2==0) {
                    return 0;
                } else {
                    return -1;
                }
            } else if(c2==0) {
                return 1;
            } else {
                /* compare non-zero characters with lowercase */
                rc=(int)(unsigned char)uprv_tolower(c1)-(int)(unsigned char)uprv_tolower(c2);
                if(rc!=0) {
                    return rc;
                }
            }
            ++str1;
            ++str2;
        }
    }
}